

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_special3(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *tcg_ctx_00;
  short offset;
  uint uVar1;
  uint op;
  uint rd_00;
  uint lsb;
  int32_t iVar2;
  uint opc;
  uint32_t sel;
  TCGv_i64 t;
  TCGv_i64 pTVar3;
  TCGv_i64 t0_1;
  TCGv_i64 t1;
  TCGv_i64 t0;
  int16_t imm;
  uint32_t op2;
  uint32_t op1;
  int sa;
  int rd;
  int rt;
  int rs;
  TCGContext_conflict6 *tcg_ctx;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x15 & 0x1f;
  op = ctx->opcode >> 0x10 & 0x1f;
  rd_00 = ctx->opcode >> 0xb & 0x1f;
  lsb = ctx->opcode >> 6 & 0x1f;
  iVar2 = sextract32(ctx->opcode,7,9);
  offset = (short)iVar2;
  opc = ctx->opcode & 0xfc000000 | ctx->opcode & 0x3f;
  if ((ctx->eva & 1U) == 0) {
code_r0x00d31da1:
    switch(opc) {
    case 0x7c000000:
    case 0x7c000004:
      check_insn(ctx,0x40);
      gen_bitops(ctx,opc,op,uVar1,lsb,rd_00);
      break;
    case 0x7c000001:
    case 0x7c000002:
    case 0x7c000003:
    case 0x7c000005:
    case 0x7c000006:
    case 0x7c000007:
      check_insn(ctx,0x100);
      check_mips_64(ctx);
      gen_bitops(ctx,opc,op,uVar1,lsb,rd_00);
      break;
    case 0x7c000008:
      check_mt(ctx);
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      t = tcg_temp_new_i64(tcg_ctx_00);
      gen_load_gpr(tcg_ctx_00,pTVar3,op);
      gen_load_gpr(tcg_ctx_00,t,uVar1);
      gen_helper_fork(tcg_ctx_00,pTVar3,t);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      tcg_temp_free_i64(tcg_ctx_00,t);
      break;
    case 0x7c000009:
      check_mt(ctx);
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      gen_load_gpr(tcg_ctx_00,pTVar3,uVar1);
      gen_helper_yield(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env,pTVar3);
      gen_store_gpr(tcg_ctx_00,pTVar3,rd_00);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    default:
      if ((ctx->insn_flags & 0x2000) == 0) {
        decode_opc_special3_legacy(env,ctx);
      }
      else {
        decode_opc_special3_r6(env,ctx);
      }
      break;
    case 0x7c000020:
      uVar1 = ctx->opcode & 0xfc0007ff;
      if ((((uVar1 == 0x7c000020) || (uVar1 == 0x7c000220)) || (uVar1 == 0x7c000260)) ||
         ((uVar1 == 0x7c0002a0 || (uVar1 == 0x7c0002e0)))) {
        check_insn(ctx,0x2000);
        decode_opc_special3_r6(env,ctx);
      }
      else {
        check_insn(ctx,0x40);
        gen_bshfl(ctx,uVar1,op,rd_00);
      }
      break;
    case 0x7c000024:
      uVar1 = ctx->opcode & 0xfc0007ff;
      if ((((uVar1 == 0x7c000024) || (uVar1 == 0x7c000224)) || (uVar1 == 0x7c000264)) ||
         ((((uVar1 == 0x7c0002a4 || (uVar1 == 0x7c0002e4)) ||
           ((uVar1 == 0x7c000324 || ((uVar1 == 0x7c000364 || (uVar1 == 0x7c0003a4)))))) ||
          (uVar1 == 0x7c0003e4)))) {
        check_insn(ctx,0x2000);
        decode_opc_special3_r6(env,ctx);
      }
      else {
        check_insn(ctx,0x100);
        check_mips_64(ctx);
        gen_bshfl(ctx,ctx->opcode & 0xfc000000 | ctx->opcode & 0x3f | ctx->opcode & 0x7c0,op,rd_00);
      }
      break;
    case 0x7c00003b:
      sel = extract32(ctx->opcode,6,3);
      gen_rdhwr(ctx,op,rd_00,sel);
    }
  }
  else {
    switch(opc) {
    case 0x7c000019:
    case 0x7c00001a:
      check_insn_opc_removed(ctx,0x2000);
    case 0x7c000028:
    case 0x7c000029:
    case 0x7c00002c:
    case 0x7c00002d:
    case 0x7c00002e:
    case 0x7c00002f:
      check_cp0_enabled(ctx);
      gen_ld(ctx,opc,op,uVar1,(int)offset);
      break;
    case 0x7c00001b:
      check_cp0_enabled(ctx);
      if ((ctx->hflags & 0x8000000) != 0) {
        gen_cache_operation(ctx,op,uVar1,offset);
      }
      break;
    case 0x7c00001e:
      check_cp0_enabled(ctx);
      gen_st_cond(ctx,op,uVar1,(int)offset,MO_LESL,true);
      break;
    default:
      goto code_r0x00d31da1;
    case 0x7c000021:
    case 0x7c000022:
      check_insn_opc_removed(ctx,0x2000);
    case 0x7c00001c:
    case 0x7c00001d:
    case 0x7c00001f:
      check_cp0_enabled(ctx);
      gen_st(ctx,opc,op,uVar1,(int)offset);
      break;
    case 0x7c000023:
      check_cp0_enabled(ctx);
    }
  }
  return;
}

Assistant:

static void decode_opc_special3(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, rt, rd, sa;
    uint32_t op1, op2;
    int16_t imm;

    rs = (ctx->opcode >> 21) & 0x1f;
    rt = (ctx->opcode >> 16) & 0x1f;
    rd = (ctx->opcode >> 11) & 0x1f;
    sa = (ctx->opcode >> 6) & 0x1f;
    imm = sextract32(ctx->opcode, 7, 9);

    op1 = MASK_SPECIAL3(ctx->opcode);

    /*
     * EVA loads and stores overlap Loongson 2E instructions decoded by
     * decode_opc_special3_legacy(), so be careful to allow their decoding when
     * EVA is absent.
     */
    if (ctx->eva) {
        switch (op1) {
        case OPC_LWLE:
        case OPC_LWRE:
            check_insn_opc_removed(ctx, ISA_MIPS32R6);
            /* fall through */
        case OPC_LBUE:
        case OPC_LHUE:
        case OPC_LBE:
        case OPC_LHE:
        case OPC_LLE:
        case OPC_LWE:
            check_cp0_enabled(ctx);
            gen_ld(ctx, op1, rt, rs, imm);
            return;
        case OPC_SWLE:
        case OPC_SWRE:
            check_insn_opc_removed(ctx, ISA_MIPS32R6);
            /* fall through */
        case OPC_SBE:
        case OPC_SHE:
        case OPC_SWE:
            check_cp0_enabled(ctx);
            gen_st(ctx, op1, rt, rs, imm);
            return;
        case OPC_SCE:
            check_cp0_enabled(ctx);
            gen_st_cond(ctx, rt, rs, imm, MO_TESL, true);
            return;
        case OPC_CACHEE:
            check_cp0_enabled(ctx);
            if (ctx->hflags & MIPS_HFLAG_ITC_CACHE) {
                gen_cache_operation(ctx, rt, rs, imm);
            }
            /* Treat as NOP. */
            return;
        case OPC_PREFE:
            check_cp0_enabled(ctx);
            /* Treat as NOP. */
            return;
        }
    }

    switch (op1) {
    case OPC_EXT:
    case OPC_INS:
        check_insn(ctx, ISA_MIPS32R2);
        gen_bitops(ctx, op1, rt, rs, sa, rd);
        break;
    case OPC_BSHFL:
        op2 = MASK_BSHFL(ctx->opcode);
        switch (op2) {
        case OPC_ALIGN:
        case OPC_ALIGN_1:
        case OPC_ALIGN_2:
        case OPC_ALIGN_3:
        case OPC_BITSWAP:
            check_insn(ctx, ISA_MIPS32R6);
            decode_opc_special3_r6(env, ctx);
            break;
        default:
            check_insn(ctx, ISA_MIPS32R2);
            gen_bshfl(ctx, op2, rt, rd);
            break;
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DEXTM:
    case OPC_DEXTU:
    case OPC_DEXT:
    case OPC_DINSM:
    case OPC_DINSU:
    case OPC_DINS:
        check_insn(ctx, ISA_MIPS64R2);
        check_mips_64(ctx);
        gen_bitops(ctx, op1, rt, rs, sa, rd);
        break;
    case OPC_DBSHFL:
        op2 = MASK_DBSHFL(ctx->opcode);
        switch (op2) {
        case OPC_DALIGN:
        case OPC_DALIGN_1:
        case OPC_DALIGN_2:
        case OPC_DALIGN_3:
        case OPC_DALIGN_4:
        case OPC_DALIGN_5:
        case OPC_DALIGN_6:
        case OPC_DALIGN_7:
        case OPC_DBITSWAP:
            check_insn(ctx, ISA_MIPS32R6);
            decode_opc_special3_r6(env, ctx);
            break;
        default:
            check_insn(ctx, ISA_MIPS64R2);
            check_mips_64(ctx);
            op2 = MASK_DBSHFL(ctx->opcode);
            gen_bshfl(ctx, op2, rt, rd);
            break;
        }
        break;
#endif
    case OPC_RDHWR:
        gen_rdhwr(ctx, rt, rd, extract32(ctx->opcode, 6, 3));
        break;
    case OPC_FORK:
        check_mt(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rt);
            gen_load_gpr(tcg_ctx, t1, rs);
            gen_helper_fork(tcg_ctx, t0, t1);
            tcg_temp_free(tcg_ctx, t0);
            tcg_temp_free(tcg_ctx, t1);
        }
        break;
    case OPC_YIELD:
        check_mt(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rs);
            gen_helper_yield(tcg_ctx, t0, tcg_ctx->cpu_env, t0);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    default:
        if (ctx->insn_flags & ISA_MIPS32R6) {
            decode_opc_special3_r6(env, ctx);
        } else {
            decode_opc_special3_legacy(env, ctx);
        }
    }
}